

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,ListSchema schema)

{
  ListBuilder builder_00;
  ListBuilder builder_01;
  ListSchema schema_00;
  ListSchema schema_01;
  ElementSize elementSize;
  Which WVar1;
  ListBuilder local_98;
  Type local_70;
  Schema local_60;
  StructSize local_54;
  ListBuilder local_50;
  Type local_28;
  undefined1 local_18 [8];
  ListSchema schema_local;
  
  schema_local.elementType._0_8_ = schema.elementType.field_4;
  local_18 = schema.elementType._0_8_;
  WVar1 = ListSchema::whichElementType((ListSchema *)local_18);
  if (WVar1 == STRUCT) {
    local_28.baseType = local_18._0_2_;
    local_28.listDepth = local_18[2];
    local_28.isImplicitParam = (bool)local_18[3];
    local_28.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_18._4_2_;
    local_28._6_2_ = local_18._6_2_;
    local_28.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    local_60.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_18);
    local_54 = anon_unknown_70::structSizeFromSchema((StructSchema)local_60.raw);
    PointerBuilder::getStructList(&local_50,&builder,local_54,(word *)0x0);
    schema_01.elementType.field_4.schema = local_28.field_4.schema;
    schema_01.elementType.baseType = local_28.baseType;
    schema_01.elementType.listDepth = local_28.listDepth;
    schema_01.elementType.isImplicitParam = local_28.isImplicitParam;
    schema_01.elementType.field_3 = local_28.field_3;
    schema_01.elementType._6_2_ = local_28._6_2_;
    builder_00.capTable = local_50.capTable;
    builder_00.segment = local_50.segment;
    builder_00.ptr = local_50.ptr;
    builder_00.elementCount = local_50.elementCount;
    builder_00.step = local_50.step;
    builder_00.structDataSize = local_50.structDataSize;
    builder_00.structPointerCount = local_50.structPointerCount;
    builder_00.elementSize = local_50.elementSize;
    builder_00._39_1_ = local_50._39_1_;
    DynamicList::Builder::Builder(__return_storage_ptr__,schema_01,builder_00);
  }
  else {
    local_70.baseType = local_18._0_2_;
    local_70.listDepth = local_18[2];
    local_70.isImplicitParam = (bool)local_18[3];
    local_70.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_18._4_2_;
    local_70._6_2_ = local_18._6_2_;
    local_70.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    WVar1 = ListSchema::whichElementType((ListSchema *)local_18);
    elementSize = anon_unknown_70::elementSizeFor(WVar1);
    PointerBuilder::getList(&local_98,&builder,elementSize,(word *)0x0);
    schema_00.elementType.field_4.schema = local_70.field_4.schema;
    schema_00.elementType.baseType = local_70.baseType;
    schema_00.elementType.listDepth = local_70.listDepth;
    schema_00.elementType.isImplicitParam = local_70.isImplicitParam;
    schema_00.elementType.field_3 = local_70.field_3;
    schema_00.elementType._6_2_ = local_70._6_2_;
    builder_01.capTable = local_98.capTable;
    builder_01.segment = local_98.segment;
    builder_01.ptr = local_98.ptr;
    builder_01.elementCount = local_98.elementCount;
    builder_01.step = local_98.step;
    builder_01.structDataSize = local_98.structDataSize;
    builder_01.structPointerCount = local_98.structPointerCount;
    builder_01.elementSize = local_98.elementSize;
    builder_01._39_1_ = local_98._39_1_;
    DynamicList::Builder::Builder(__return_storage_ptr__,schema_00,builder_01);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::getDynamic(
    PointerBuilder builder, ListSchema schema) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.getStructList(
            structSizeFromSchema(schema.getStructElementType()),
            nullptr));
  } else {
    return DynamicList::Builder(schema,
        builder.getList(elementSizeFor(schema.whichElementType()), nullptr));
  }
}